

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles3::Functional::eval_selection_vec3(ShaderEvalContext *c)

{
  Vector<float,_3> *v;
  Vector<float,_3> local_50;
  Vector<float,_3> local_40;
  Vector<float,_3> local_34;
  VecAccess<float,_4,_3> local_28;
  
  local_50.m_data[2] = c->in[1].m_data[0];
  local_50.m_data._0_8_ = *(undefined8 *)(c->in[1].m_data + 1);
  local_40.m_data[0] = c->in[2].m_data[3];
  local_40.m_data._4_8_ = *(undefined8 *)(c->in[2].m_data + 1);
  v = &local_40;
  if (0.0 < c->in[0].m_data[2]) {
    v = &local_50;
  }
  tcu::Vector<float,_3>::Vector(&local_34,v);
  local_28.m_vector = &c->color;
  local_28.m_index[0] = 0;
  local_28.m_index[1] = 1;
  local_28.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_28,&local_34);
  return;
}

Assistant:

void eval_selection_vec3	(ShaderEvalContext& c) { c.color.xyz()	= selection(c.in[0].z() > 0.0f,		c.in[1].swizzle(1, 2, 0),		c.in[2].swizzle(3, 1, 2)); }